

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O3

wchar_t pax_attribute_SCHILY_xattr
                  (archive_entry *entry,char *name,size_t name_length,char *value,
                  size_t value_length)

{
  char *name_00;
  wchar_t wVar1;
  
  wVar1 = L'\x01';
  if (name_length < 0x81) {
    name_00 = (char *)malloc(name_length + 1);
    wVar1 = L'\0';
    if (name_00 != (char *)0x0) {
      memcpy(name_00,name,name_length);
      name_00[name_length] = '\0';
      archive_entry_xattr_add_entry(entry,name_00,value,value_length);
      free(name_00);
      wVar1 = L'\0';
    }
  }
  return wVar1;
}

Assistant:

static int
pax_attribute_SCHILY_xattr(struct archive_entry *entry,
	const char *name, size_t name_length, const char *value, size_t value_length)
{
	if (name_length < 1 || name_length > 128) {
		return 1;
	}

	char * null_terminated_name = malloc(name_length + 1);
	if (null_terminated_name != NULL) {
		memcpy(null_terminated_name, name, name_length);
		null_terminated_name[name_length] = '\0';
		archive_entry_xattr_add_entry(entry, null_terminated_name, value, value_length);
		free(null_terminated_name);
	}

	return 0;
}